

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::PositionColorShader::PositionColorShader
          (PositionColorShader *this)

{
  undefined *puVar1;
  ShaderProgramDeclaration *pSVar2;
  allocator<char> local_261;
  string local_260;
  FragmentSource local_240;
  allocator<char> local_219;
  string local_218;
  VertexSource local_1f8;
  FragmentOutput local_1d8;
  VertexToFragmentVarying local_1d4;
  allocator<char> local_1c9;
  string local_1c8;
  VertexAttribute local_1a8;
  allocator<char> local_169;
  string local_168;
  VertexAttribute local_148;
  ShaderProgramDeclaration local_120;
  PositionColorShader *local_10;
  PositionColorShader *this_local;
  
  local_10 = this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"a_position",&local_169);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_148,&local_168,GENERICVECTYPE_FLOAT);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_120,&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"a_color",&local_1c9);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1a8,&local_1c8,GENERICVECTYPE_FLOAT);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1a8);
  sglr::pdec::VertexToFragmentVarying::VertexToFragmentVarying(&local_1d4,GENERICVECTYPE_FLOAT,0);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1d4);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_1d8,GENERICVECTYPE_FLOAT);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1d8);
  puVar1 = (anonymous_namespace)::s_shaderSourceVertex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,puVar1,&local_219);
  sglr::pdec::VertexSource::VertexSource(&local_1f8,&local_218);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1f8);
  puVar1 = (anonymous_namespace)::s_shaderSourceFragment;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,puVar1,&local_261);
  sglr::pdec::FragmentSource::FragmentSource(&local_240,&local_260);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_240);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar2);
  sglr::pdec::FragmentSource::~FragmentSource(&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  sglr::pdec::VertexSource::~VertexSource(&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_120);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00cb3418;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00cb3450;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00cb3468;
  return;
}

Assistant:

PositionColorShader::PositionColorShader (void)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource(s_shaderSourceVertex)
							<< sglr::pdec::FragmentSource(s_shaderSourceFragment))
{
}